

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

void Opa_ManPerform(Gia_Man_t *pGia)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Opa_Man_t *p;
  Vec_Int_t *pVVar5;
  int *__s;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj;
  uint uVar7;
  int i;
  size_t __size;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int **ppiVar12;
  int local_44;
  
  p = (Opa_Man_t *)calloc(1,0x28);
  p->pGia = pGia;
  pVVar5 = (Vec_Int_t *)calloc((long)pGia->vCos->nSize - (long)pGia->nRegs,0x10);
  p->pvParts = pVVar5;
  __size = (long)pGia->nObjs << 2;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  p->pId2Part = __s;
  p_00 = Vec_IntAlloc(100);
  p->vFront = p_00;
  for (lVar8 = 0; uVar9 = (long)pGia->vCos->nSize - (long)pGia->nRegs, lVar8 < (long)uVar9;
      lVar8 = lVar8 + 1) {
    pGVar6 = Gia_ManCo(pGia,(int)lVar8);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      uVar9 = (ulong)(uint)(pGia->vCos->nSize - pGia->nRegs);
      break;
    }
    iVar3 = Gia_ObjId(pGia,pGVar6);
    Vec_IntPush(pVVar5,iVar3);
    iVar3 = Gia_ObjId(pGia,pGVar6);
    __s[iVar3] = (int)lVar8;
    iVar3 = Gia_ObjId(pGia,pGVar6);
    Vec_IntPush(p_00,iVar3);
    pVVar5 = pVVar5 + 1;
  }
  p->nParts = (int)uVar9;
  local_44 = p_00->nSize;
  iVar3 = 0;
  uVar11 = 0;
  while (pVVar5 = p->vFront, iVar3 < pVVar5->nSize) {
    iVar4 = Vec_IntEntry(pVVar5,iVar3);
    pGVar6 = Gia_ManObj(pGia,iVar4);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if (iVar3 == local_44) {
      uVar10 = uVar11 + 1;
      printf("%6d : %6d -> %6d\n",(ulong)uVar10,iVar3,uVar9 & 0xffffffff);
      local_44 = pVVar5->nSize;
      bVar2 = 0 < (int)uVar11;
      uVar11 = uVar10;
      if (bVar2) {
        printf("Groups %d: ",uVar9 & 0xffffffff);
        pGVar1 = p->pGia;
        for (lVar8 = 0; lVar8 < (long)pGVar1->vCos->nSize - (long)pGVar1->nRegs; lVar8 = lVar8 + 1)
        {
          iVar4 = p->pvParts[lVar8].nSize;
          if (iVar4 != 0) {
            pVVar5 = p->pvParts + lVar8;
            uVar10 = 0;
            for (i = 0; i < iVar4; i = i + 1) {
              iVar4 = Vec_IntEntry(pVVar5,i);
              pObj = Gia_ManObj(pGVar1,iVar4);
              if (pObj == (Gia_Obj_t *)0x0) break;
              uVar7 = 0;
              if ((~*(uint *)pObj & 0x1fffffff) != 0 && (int)*(uint *)pObj < 0) {
                iVar4 = Gia_ObjCioId(pObj);
                uVar7 = (uint)(iVar4 < pGVar1->vCos->nSize - pGVar1->nRegs);
              }
              uVar10 = uVar10 + uVar7;
              iVar4 = pVVar5->nSize;
            }
            printf("%d ",(ulong)uVar10);
          }
        }
        putchar(10);
      }
    }
    iVar4 = (int)*(ulong *)pGVar6;
    uVar9 = *(ulong *)pGVar6 & 0x1fffffff;
    if (uVar9 == 0x1fffffff || iVar4 < 0) {
      if ((-1 < iVar4) || ((int)uVar9 == 0x1fffffff)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                      ,0xc5,"void Opa_ManPerform(Gia_Man_t *)");
      }
    }
    else {
      Opa_ManMoveOne(p,pGVar6,pGVar6 + -uVar9);
      uVar9 = (ulong)(*(uint *)&pGVar6->field_0x4 & 0x1fffffff);
    }
    Opa_ManMoveOne(p,pGVar6,pGVar6 + -uVar9);
    uVar9 = (ulong)(uint)p->nParts;
    if ((p->nParts == 1) || (iVar3 = iVar3 + 1, uVar11 == 5)) break;
  }
  putchar(10);
  Vec_IntFree(p->vFront);
  pGVar1 = p->pGia;
  pVVar5 = p->pvParts;
  ppiVar12 = &pVVar5->pArray;
  for (lVar8 = 0; lVar8 < (long)pGVar1->vCos->nSize - (long)pGVar1->nRegs; lVar8 = lVar8 + 1) {
    if (*ppiVar12 != (int *)0x0) {
      free(*ppiVar12);
      *ppiVar12 = (int *)0x0;
    }
    ppiVar12 = ppiVar12 + 2;
  }
  free(pVVar5);
  free(p->pId2Part);
  free(p);
  return;
}

Assistant:

void Opa_ManPerform( Gia_Man_t * pGia )
{
    Opa_Man_t * p;
    Gia_Obj_t * pObj;
    int i, Limit, Count = 0;
 
    p = Opa_ManStart( pGia );
    Limit = Vec_IntSize(p->vFront);
//Opa_ManPrint2( p );
    Gia_ManForEachObjVec( p->vFront, pGia, pObj, i )
    {
        if ( i == Limit )
        {
            printf( "%6d : %6d -> %6d\n", ++Count, i, p->nParts );
            Limit = Vec_IntSize(p->vFront);
            if ( Count > 1 )
                Opa_ManPrint2( p );
        }
//        printf( "*** Object %d  ", Gia_ObjId(pGia, pObj) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin1(pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
        else assert( 0 );
//        if ( i % 10 == 0 )
//            printf( "%d   ", p->nParts );
        if ( p->nParts == 1 )
            break;
        if ( Count == 5 )
            break;
    }
    printf( "\n" );
    Opa_ManStop( p );
}